

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::X3DImporter::GeometryHelper_MakeMesh
          (X3DImporter *this,vector<int,_std::allocator<int>_> *pCoordIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  pointer paVar4;
  pointer paVar5;
  aiMesh *this_00;
  ulong *puVar6;
  aiFace *paVar7;
  reference o;
  ulong uVar8;
  aiVector3D *paVar9;
  DeadlyImportError *this_01;
  aiFace *paVar10;
  long lVar11;
  size_t i;
  size_type __n;
  _Self __tmp;
  ulong uVar12;
  _List_node_base *p_Var13;
  ulong uVar14;
  bool bVar15;
  allocator<char> local_6d;
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  string local_50;
  
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prim_type = 0;
  GeometryHelper_CoordIdxStr2FacesArr(this,pCoordIdx,&faces,&prim_type);
  if (faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    this_00 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_00);
    paVar5 = faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar4 = faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar12 = (long)uVar14 >> 4;
    puVar6 = (ulong *)operator_new__(-(ulong)(uVar12 >> 0x3c != 0) | uVar14 | 8);
    *puVar6 = uVar12;
    paVar7 = (aiFace *)(puVar6 + 1);
    if (paVar5 != paVar4) {
      paVar10 = paVar7;
      do {
        paVar10->mNumIndices = 0;
        paVar10->mIndices = (uint *)0x0;
        paVar10 = paVar10 + 1;
      } while (paVar10 != (aiFace *)(uVar14 + (long)paVar7));
    }
    this_00->mFaces = paVar7;
    this_00->mNumFaces = (uint)uVar12;
    lVar11 = 0;
    for (__n = 0; uVar12 != __n; __n = __n + 1) {
      o = std::vector<aiFace,_std::allocator<aiFace>_>::at(&faces,__n);
      aiFace::operator=((aiFace *)((long)&this_00->mFaces->mNumIndices + lVar11),o);
      lVar11 = lVar11 + 0x10;
    }
    p_Var13 = (pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl._M_node.super__List_node_base._M_next;
    uVar12 = (pVertices->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node._M_size;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar12;
    uVar8 = SUB168(auVar2 * ZEXT816(0xc),0);
    uVar14 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
      uVar14 = uVar8;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar14);
    if (uVar12 != 0) {
      uVar8 = uVar8 - 0xc;
      memset(paVar9,0,(uVar8 - uVar8 % 0xc) + 0xc);
    }
    this_00->mVertices = paVar9;
    this_00->mNumVertices = (uint)uVar12;
    lVar11 = 0;
    while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
      p_Var1 = p_Var13[1]._M_next;
      p_Var3 = p_Var13 + 1;
      p_Var13 = p_Var13->_M_next;
      paVar9 = this_00->mVertices;
      *(undefined4 *)((long)&paVar9->z + lVar11) = *(undefined4 *)&p_Var3->_M_prev;
      *(_List_node_base **)((long)&paVar9->x + lVar11) = p_Var1;
      lVar11 = lVar11 + 0xc;
    }
    this_00->mPrimitiveTypes = prim_type;
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&faces);
    return this_00;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Failed to create mesh, faces list is empty.",&local_6d);
  DeadlyImportError::DeadlyImportError(this_01,&local_50);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

aiMesh* X3DImporter::GeometryHelper_MakeMesh(const std::vector<int32_t>& pCoordIdx, const std::list<aiVector3D>& pVertices) const
{
    std::vector<aiFace> faces;
    unsigned int prim_type = 0;

	// create faces array from input string with vertices indices.
	GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
    if ( !faces.size() )
    {
        throw DeadlyImportError( "Failed to create mesh, faces list is empty." );
    }

	//
	// Create new mesh and copy geometry data.
	//
    aiMesh *tmesh = new aiMesh;
    size_t ts = faces.size();
	// faces
	tmesh->mFaces = new aiFace[ts];
	tmesh->mNumFaces = static_cast<unsigned int>(ts);
	for(size_t i = 0; i < ts; i++) tmesh->mFaces[i] = faces.at(i);

	// vertices
	std::list<aiVector3D>::const_iterator vit = pVertices.begin();

	ts = pVertices.size();
	tmesh->mVertices = new aiVector3D[ts];
	tmesh->mNumVertices = static_cast<unsigned int>(ts);
    for ( size_t i = 0; i < ts; i++ )
    {
        tmesh->mVertices[ i ] = *vit++;
    }

	// set primitives type and return result.
	tmesh->mPrimitiveTypes = prim_type;

	return tmesh;
}